

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_fragmentation.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  
  auVar1 = _DAT_00102020;
  uVar4 = '\0';
  uVar5 = '\x01';
  uVar6 = '\x02';
  uVar7 = '\x03';
  uVar8 = '\x04';
  uVar9 = '\x05';
  uVar10 = '\x06';
  uVar11 = '\a';
  uVar12 = '\b';
  uVar13 = '\t';
  uVar14 = '\n';
  uVar15 = '\v';
  uVar16 = '\f';
  uVar17 = '\r';
  uVar18 = '\x0e';
  uVar19 = '\x0f';
  lVar3 = 0;
  do {
    tlv_value_buffer[lVar3] = uVar4;
    tlv_value_buffer[lVar3 + 1] = uVar5;
    tlv_value_buffer[lVar3 + 2] = uVar6;
    tlv_value_buffer[lVar3 + 3] = uVar7;
    tlv_value_buffer[lVar3 + 4] = uVar8;
    tlv_value_buffer[lVar3 + 5] = uVar9;
    tlv_value_buffer[lVar3 + 6] = uVar10;
    tlv_value_buffer[lVar3 + 7] = uVar11;
    tlv_value_buffer[lVar3 + 8] = uVar12;
    tlv_value_buffer[lVar3 + 9] = uVar13;
    tlv_value_buffer[lVar3 + 10] = uVar14;
    tlv_value_buffer[lVar3 + 0xb] = uVar15;
    tlv_value_buffer[lVar3 + 0xc] = uVar16;
    tlv_value_buffer[lVar3 + 0xd] = uVar17;
    tlv_value_buffer[lVar3 + 0xe] = uVar18;
    tlv_value_buffer[lVar3 + 0xf] = uVar19;
    lVar3 = lVar3 + 0x10;
    uVar4 = uVar4 + auVar1[0];
    uVar5 = uVar5 + auVar1[1];
    uVar6 = uVar6 + auVar1[2];
    uVar7 = uVar7 + auVar1[3];
    uVar8 = uVar8 + auVar1[4];
    uVar9 = uVar9 + auVar1[5];
    uVar10 = uVar10 + auVar1[6];
    uVar11 = uVar11 + auVar1[7];
    uVar12 = uVar12 + auVar1[8];
    uVar13 = uVar13 + auVar1[9];
    uVar14 = uVar14 + auVar1[10];
    uVar15 = uVar15 + auVar1[0xb];
    uVar16 = uVar16 + auVar1[0xc];
    uVar17 = uVar17 + auVar1[0xd];
    uVar18 = uVar18 + auVar1[0xe];
    uVar19 = uVar19 + auVar1[0xf];
  } while (lVar3 != 0x100);
  rfc5444_writer_init(&writer);
  rfc5444_writer_register_target(&writer,&small_if);
  rfc5444_writer_register_target(&writer,&large_if);
  lVar3 = rfc5444_writer_register_message(&writer,1,0);
  *(code **)(lVar3 + 0xd8) = addMessageHeader;
  *(code **)(lVar3 + 0xe0) = finishMessageHeader;
  rfc5444_writer_register_msgcontentprovider(&writer,&cpr,addrtlvs,1);
  BEGIN_TESTING(clear_elements);
  cunit_start_test("test_frag_80_1");
  tlvcount = 1;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar2 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar2 == 0,"test_frag_80_1",0xaa,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 1,"test_frag_80_1",0xae,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 1,"test_frag_80_1",0xaf,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_80_1",0xb0,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_1");
  cunit_start_test("test_frag_80_2");
  tlvcount = 2;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar2 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar2 == 0,"test_frag_80_2",0xbc,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 2,"test_frag_80_2",0xc0,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 2,"test_frag_80_2",0xc1,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_80_2",0xc2,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_2");
  cunit_start_test("test_frag_80_3");
  tlvcount = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x50;
  iVar2 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar2 == 0,"test_frag_80_3",0xce,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 3,"test_frag_80_3",0xd2,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 3,"test_frag_80_3",0xd3,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 2,"test_frag_80_3",0xd4,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_80_3");
  cunit_start_test("test_frag_50_3");
  tlvcount = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x32;
  iVar2 = rfc5444_writer_create_message(&writer,1,4,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar2 == 0,"test_frag_50_3",0xe0,"Parser should return 0");
  rfc5444_writer_flush(&writer,&small_if,0);
  rfc5444_writer_flush(&writer,&large_if,0);
  cunit_named_check(fragments == 2,"test_frag_50_3",0xe4,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 2,"test_frag_50_3",0xe5,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 1,"test_frag_50_3",0xe6,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_50_3");
  cunit_start_test("test_frag_150_3");
  tlvcount = 3;
  tlv_value = tlv_value_buffer;
  tlv_value_size = 0x96;
  iVar2 = rfc5444_writer_create_message(&writer,4,1,rfc5444_writer_alltargets_selector,0);
  cunit_named_check(iVar2 != 0,"test_frag_150_3",0xf2,"Parser should return -1");
  cunit_named_check(fragments == 0,"test_frag_150_3",0xf4,"bad number of fragments: %d\n");
  cunit_named_check(packets_0 == 0,"test_frag_150_3",0xf5,"bad number of packets on if 1: %d\n");
  cunit_named_check(packets_1 == 0,"test_frag_150_3",0xf6,"bad number of packets on if 2: %d\n");
  cunit_end_test("test_frag_150_3");
  rfc5444_writer_cleanup(&writer);
  iVar2 = FINISH_TESTING();
  return iVar2;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  struct rfc5444_writer_message *msg;
  size_t i;

  for (i=0; i<sizeof(tlv_value_buffer); i++) {
    tlv_value_buffer[i] = i;
  }

  rfc5444_writer_init(&writer);

  rfc5444_writer_register_target(&writer, &small_if);
  rfc5444_writer_register_target(&writer, &large_if);

  msg = rfc5444_writer_register_message(&writer, MSG_TYPE, false);
  msg->addMessageHeader = addMessageHeader;
  msg->finishMessageHeader = finishMessageHeader;

  rfc5444_writer_register_msgcontentprovider(&writer, &cpr, addrtlvs, ARRAYSIZE(addrtlvs));

  BEGIN_TESTING(clear_elements);

  test_frag_80_1();
  test_frag_80_2();
  test_frag_80_3();
  test_frag_50_3();
  test_frag_150_3();

  rfc5444_writer_cleanup(&writer);

  return FINISH_TESTING();
}